

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

void __thiscall TCV::visit(TCV *this,AddOp *node)

{
  uint uVar1;
  pointer pcVar2;
  uint __val;
  uint uVar3;
  bool bVar4;
  ASTNode *pAVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  string errorString;
  string rhsType;
  string lhsType;
  string __str;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pAVar5 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  (**pAVar5->_vptr_ASTNode)(pAVar5,this);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (this->returnType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->returnType)._M_string_length);
  pAVar5 = AST::ASTNode::getChild(&node->super_ASTNode,2);
  (**pAVar5->_vptr_ASTNode)(pAVar5,this);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (this->returnType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->returnType)._M_string_length);
  bVar4 = isMatchType(&local_70,&local_90);
  if (!bVar4) {
    uVar1 = this->position;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0012e48d;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0012e48d;
        }
        if (uVar7 < 10000) goto LAB_0012e48d;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_0012e48d:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_50[0]),__len,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x139a45);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Semantic::Detector::addError(this->detector,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TCV::visit(AddOp *node) {
    node->getChild(0)->accept(*this);
    std::string lhsType = returnType;
    node->getChild(2)->accept(*this);
    std::string rhsType = returnType;
    if (!isMatchType(lhsType, rhsType)) {
        std::string errorString = "Unmatched type at line " + std::to_string(position);
        detector->addError(errorString);
    }
}